

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::callable> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::callable>,64ul,cs_impl::default_allocator_provider>::
alloc<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
          (allocator_type<cs_impl::any::holder<cs::callable>,_64UL,_cs_impl::default_allocator_provider>
           *this,_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *args,
          types *args_1)

{
  undefined8 uVar1;
  __int_type_conflict _Var2;
  holder<cs::callable> *__args;
  holder<cs::callable> *in_RDX;
  new_allocator<cs_impl::any::holder<cs::callable>_> *in_RSI;
  types *in_RDI;
  holder<cs::callable> *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (*(undefined8 *)(in_RDI + 0x82) != normal) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      uVar1 = *(undefined8 *)(in_RDI + 0x82);
      *(undefined8 *)(in_RDI + 0x82) = uVar1 - request_fold;
      __args = *(holder<cs::callable> **)(in_RDI + uVar1 * 2 + -2);
      goto LAB_00244334;
    }
  }
  __args = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::callable>_>::allocate
                     (in_RSI,(size_type)in_RDX,pvVar3);
LAB_00244334:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::callable>>::
  construct<cs_impl::any::holder<cs::callable>,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            (in_RSI,in_RDX,
             (_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)__args,in_RDI);
  return __args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}